

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

void draw_arrow2(Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0x3fe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0x3fe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_arrow2(Fl_Color col)
{
  fl_color(col);
  BP; vv(-0.3,0.8); vv(0.50,0.0); vv(-0.3,-0.8); EP;
  set_outline_color(col);
  BC; vv(-0.3,0.8); vv(0.50,0.0); vv(-0.3,-0.8); EC;
}